

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O3

string * SleighArchitecture::normalizeProcessor(string *__return_storage_ptr__,string *nm)

{
  pointer pcVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::find((char *)nm,0x34b012,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar2 == -1) {
    pcVar1 = (nm->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + nm->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"x86","");
  }
  return __return_storage_ptr__;
}

Assistant:

string SleighArchitecture::normalizeProcessor(const string &nm)

{
  if (nm.find("386")!=string::npos)
    return "x86";
  return nm;
}